

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O0

void __thiscall OpenMD::HullFinder::HullFinder(HullFinder *this,SimInfo *info)

{
  int iVar1;
  reference ppMVar2;
  reference ppSVar3;
  reference ppBVar4;
  reference ppBVar5;
  reference ppTVar6;
  reference ppIVar7;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  RigidBody *rb;
  Atom *atom;
  StuntDouble *sd;
  Molecule *mol;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  RigidBodyIterator rbIter;
  AtomIterator ai;
  IntegrableObjectIterator ioi;
  MoleculeIterator mi;
  value_type_conflict1 *in_stack_fffffffffffffd38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd40;
  Inversion *in_stack_fffffffffffffd48;
  Inversion *in_stack_fffffffffffffd50;
  vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  Inversion *local_b8;
  Torsion *local_b0;
  Bend *local_a8;
  Bond *local_a0;
  RigidBody *local_98;
  Atom *local_90;
  StuntDouble *local_88;
  Molecule *local_80;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_78;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_70;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_68;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_60;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_58;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_50;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_40;
  int local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_14;
  
  *in_RDI = in_RSI;
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x2dd323);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::vector
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)0x2dd33c);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::vector
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)0x2dd355);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::vector
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)0x2dd36e);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::vector
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)0x2dd387);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::vector
            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)0x2dd3a0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2dd3c7);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x2dd3e3);
  iVar1 = SimInfo::getNGlobalAtoms((SimInfo *)*in_RDI);
  local_14 = SimInfo::getNGlobalRigidBodies((SimInfo *)*in_RDI);
  local_14 = iVar1 + local_14;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_28 = SimInfo::getNGlobalBonds((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_2c = SimInfo::getNGlobalBends((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_30 = SimInfo::getNGlobalTorsions((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_34 = SimInfo::getNGlobalInversions((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_38 = SimInfo::getNGlobalMolecules((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),0);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),1);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),2);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),3);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),4);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),5);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_50);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_58);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_60);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_68);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_70);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_78);
  local_80 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                        (MoleculeIterator *)in_stack_fffffffffffffd58);
  while (local_80 != (Molecule *)0x0) {
    iVar1 = Molecule::getGlobalIndex(local_80);
    ppMVar2 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                        ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                         (in_RDI + 0x10),(long)iVar1);
    *ppMVar2 = local_80;
    local_88 = Molecule::beginIntegrableObject
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (iterator *)in_stack_fffffffffffffd58);
    while (local_88 != (StuntDouble *)0x0) {
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                 in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
      local_88 = Molecule::nextIntegrableObject
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (iterator *)in_stack_fffffffffffffd58);
    }
    local_90 = Molecule::beginAtom((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                   (iterator *)in_stack_fffffffffffffd58);
    while (local_90 != (Atom *)0x0) {
      iVar1 = StuntDouble::getGlobalIndex(&local_90->super_StuntDouble);
      ppSVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RDI + 1),(long)iVar1);
      *ppSVar3 = &local_90->super_StuntDouble;
      local_90 = Molecule::nextAtom((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                    (iterator *)in_stack_fffffffffffffd58);
    }
    local_98 = Molecule::beginRigidBody
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (iterator *)in_stack_fffffffffffffd58);
    while (local_98 != (RigidBody *)0x0) {
      iVar1 = StuntDouble::getGlobalIndex(&local_98->super_StuntDouble);
      ppSVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RDI + 1),(long)iVar1);
      *ppSVar3 = &local_98->super_StuntDouble;
      local_98 = Molecule::nextRigidBody
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (iterator *)in_stack_fffffffffffffd58);
    }
    local_a0 = Molecule::beginBond((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                   (iterator *)in_stack_fffffffffffffd58);
    while (local_a0 != (Bond *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_a0->super_ShortRangeInteraction);
      ppBVar4 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                          ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RDI + 4),
                           (long)iVar1);
      *ppBVar4 = local_a0;
      local_a0 = Molecule::nextBond((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                    (iterator *)in_stack_fffffffffffffd58);
    }
    local_a8 = Molecule::beginBend((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                   (iterator *)in_stack_fffffffffffffd58);
    while (local_a8 != (Bend *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_a8->super_ShortRangeInteraction);
      ppBVar5 = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                          ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RDI + 7),
                           (long)iVar1);
      *ppBVar5 = local_a8;
      local_a8 = Molecule::nextBend((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                    (iterator *)in_stack_fffffffffffffd58);
    }
    local_b0 = Molecule::beginTorsion
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (iterator *)in_stack_fffffffffffffd58);
    while (local_b0 != (Torsion *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_b0->super_ShortRangeInteraction);
      ppTVar6 = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                          ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
                           (in_RDI + 10),(long)iVar1);
      *ppTVar6 = local_b0;
      local_b0 = Molecule::nextTorsion
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (iterator *)in_stack_fffffffffffffd58);
    }
    local_b8 = Molecule::beginInversion
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (iterator *)in_stack_fffffffffffffd58);
    while (local_b8 != (Inversion *)0x0) {
      in_stack_fffffffffffffd58 =
           (vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)(in_RDI + 0xd);
      in_stack_fffffffffffffd64 =
           ShortRangeInteraction::getGlobalIndex(&local_b8->super_ShortRangeInteraction);
      ppIVar7 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                          (in_stack_fffffffffffffd58,(long)in_stack_fffffffffffffd64);
      *ppIVar7 = local_b8;
      in_stack_fffffffffffffd48 =
           Molecule::nextInversion
                     ((Molecule *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      (iterator *)in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd50 = local_b8;
      local_b8 = in_stack_fffffffffffffd48;
    }
    local_80 = SimInfo::nextMolecule
                         ((SimInfo *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (MoleculeIterator *)in_stack_fffffffffffffd58);
  }
  return;
}

Assistant:

HullFinder::HullFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      // Hull is constructed from all known integrable objects.
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        localSites_.push_back(sd);
      }

      // selection can include atoms (which may be a subset of the IOs)
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }

      // and rigid bodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }

      // These others are going to be inferred from the objects on the hull:
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
#ifdef HAVE_QHULL
    surfaceMesh_ = new ConvexHull();
#endif
  }